

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx::SubGridIntersectorKPluecker<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 (*pauVar61) [16];
  undefined4 uVar62;
  int iVar63;
  uint uVar64;
  long lVar65;
  long lVar66;
  uint uVar67;
  uint uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar87;
  float fVar88;
  float fVar91;
  float fVar92;
  float fVar94;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar89;
  float fVar90;
  float fVar93;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  float fVar117;
  float fVar119;
  float fVar121;
  float fVar122;
  undefined1 auVar112 [32];
  float fVar118;
  undefined1 auVar113 [32];
  float fVar116;
  float fVar120;
  undefined1 auVar114 [32];
  float fVar123;
  float fVar124;
  float fVar134;
  float fVar135;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar136;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar133 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  float fVar149;
  float fVar153;
  undefined1 auVar146 [32];
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar147 [64];
  float fVar154;
  float fVar162;
  float fVar163;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar158 [32];
  float fVar164;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  float fVar173;
  float fVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar177 [64];
  float fVar190;
  undefined1 auVar191 [32];
  float fVar198;
  float fVar200;
  float fVar202;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar199;
  float fVar201;
  float fVar203;
  undefined1 auVar194 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar218 [32];
  float fVar225;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar226 [32];
  float fVar234;
  undefined1 auVar227 [32];
  float fVar235;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar236 [32];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1629;
  undefined1 (*local_1628) [16];
  uint local_1620;
  uint local_161c;
  ulong local_1618;
  undefined1 local_1610 [16];
  int local_1600;
  int iStack_15fc;
  int iStack_15f8;
  int iStack_15f4;
  undefined8 *local_15f0;
  undefined1 (*local_15e8) [16];
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  ulong local_15b8;
  long local_15b0;
  ulong local_15a8;
  ulong local_15a0;
  ulong local_1598;
  ulong local_1590;
  ulong local_1588;
  ulong local_1580;
  long local_1578;
  ulong local_1570;
  ulong local_1568;
  long local_1560;
  long local_1558;
  Scene *local_1550;
  ulong local_1548;
  undefined4 local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  RTCFilterFunctionNArguments local_1510;
  undefined1 local_14e0 [16];
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 local_1460 [8];
  float fStack_1458;
  float fStack_1454;
  undefined1 local_1450 [16];
  int local_1440;
  int iStack_143c;
  int iStack_1438;
  int iStack_1434;
  undefined1 local_1430 [8];
  float fStack_1428;
  float fStack_1424;
  undefined1 local_1420 [8];
  float fStack_1418;
  float fStack_1414;
  undefined1 local_1410 [8];
  float fStack_1408;
  float fStack_1404;
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  undefined4 local_13f0;
  undefined4 uStack_13ec;
  undefined4 uStack_13e8;
  undefined4 uStack_13e4;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 *local_1320;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [8];
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1628 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar62 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1450._4_4_ = uVar62;
  local_1450._0_4_ = uVar62;
  local_1450._8_4_ = uVar62;
  local_1450._12_4_ = uVar62;
  auVar172 = ZEXT1664(local_1450);
  uVar62 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1610._4_4_ = uVar62;
  local_1610._0_4_ = uVar62;
  local_1610._8_4_ = uVar62;
  local_1610._12_4_ = uVar62;
  uStack_13e4 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  fVar74 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar148 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar79 = ZEXT416((uint)(fVar74 * 0.99999964));
  local_13a0 = vshufps_avx(auVar79,auVar79,0);
  auVar194 = ZEXT1664(local_13a0);
  auVar79 = ZEXT416((uint)(fVar87 * 0.99999964));
  _local_1460 = vshufps_avx(auVar79,auVar79,0);
  auVar177 = ZEXT1664(_local_1460);
  auVar147 = ZEXT1664(local_1610);
  auVar79 = ZEXT416((uint)(fVar148 * 0.99999964));
  _local_1400 = vshufps_avx(auVar79,auVar79,0);
  auVar79 = ZEXT416((uint)(fVar74 * 1.0000004));
  _local_1410 = vshufps_avx(auVar79,auVar79,0);
  auVar79 = ZEXT416((uint)(fVar87 * 1.0000004));
  _local_1420 = vshufps_avx(auVar79,auVar79,0);
  auVar79 = ZEXT416((uint)(fVar148 * 1.0000004));
  _local_1430 = vshufps_avx(auVar79,auVar79,0);
  local_1580 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1588 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1590 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1598 = local_1580 ^ 0x10;
  local_15a0 = local_1588 ^ 0x10;
  local_15a8 = local_1590 ^ 0x10;
  iStack_1434 = (tray->tnear).field_0.i[k];
  iStack_15f4 = (tray->tfar).field_0.i[k];
  local_1200._16_16_ = mm_lookupmask_ps._240_16_;
  local_1200._0_16_ = mm_lookupmask_ps._0_16_;
  uVar67 = 1 << ((byte)k & 0x1f);
  local_15b8 = local_1580 >> 2;
  local_15e8 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar67 & 0xf) << 4));
  local_15f0 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar67 >> 4) * 0x10);
  local_15c0 = local_1598 >> 2;
  local_15c8 = local_1588 >> 2;
  local_15d0 = local_15a0 >> 2;
  local_15d8 = local_1590 >> 2;
  local_15e0 = local_15a8 >> 2;
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = &DAT_3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar80._8_4_ = 0xbf800000;
  auVar80._0_8_ = 0xbf800000bf800000;
  auVar80._12_4_ = 0xbf800000;
  auVar80._16_4_ = 0xbf800000;
  auVar80._20_4_ = 0xbf800000;
  auVar80._24_4_ = 0xbf800000;
  auVar80._28_4_ = 0xbf800000;
  _local_1220 = vblendvps_avx(auVar112,auVar80,local_1200);
  uStack_13e8 = uStack_13e4;
  uStack_13ec = uStack_13e4;
  local_13f0 = uStack_13e4;
  iStack_1438 = iStack_1434;
  iStack_143c = iStack_1434;
  local_1440 = iStack_1434;
  iStack_15f8 = iStack_15f4;
  iStack_15fc = iStack_15f4;
  local_1600 = iStack_15f4;
  while (local_1628 != (undefined1 (*) [16])&local_fa0) {
    pauVar61 = local_1628 + -1;
    local_1628 = local_1628 + -1;
    if (*(float *)(*pauVar61 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar72 = *(ulong *)*local_1628;
      do {
        if ((uVar72 & 8) == 0) {
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + local_1580),auVar172._0_16_);
          auVar76._0_4_ = auVar194._0_4_ * auVar79._0_4_;
          auVar76._4_4_ = auVar194._4_4_ * auVar79._4_4_;
          auVar76._8_4_ = auVar194._8_4_ * auVar79._8_4_;
          auVar76._12_4_ = auVar194._12_4_ * auVar79._12_4_;
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + local_1588),auVar147._0_16_);
          auVar95._0_4_ = auVar177._0_4_ * auVar79._0_4_;
          auVar95._4_4_ = auVar177._4_4_ * auVar79._4_4_;
          auVar95._8_4_ = auVar177._8_4_ * auVar79._8_4_;
          auVar95._12_4_ = auVar177._12_4_ * auVar79._12_4_;
          auVar79 = vmaxps_avx(auVar76,auVar95);
          auVar9._4_4_ = uStack_13ec;
          auVar9._0_4_ = local_13f0;
          auVar9._8_4_ = uStack_13e8;
          auVar9._12_4_ = uStack_13e4;
          auVar10 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + local_1590),auVar9);
          auVar96._0_4_ = auVar10._0_4_ * (float)local_1400._0_4_;
          auVar96._4_4_ = auVar10._4_4_ * (float)local_1400._4_4_;
          auVar96._8_4_ = auVar10._8_4_ * fStack_13f8;
          auVar96._12_4_ = auVar10._12_4_ * fStack_13f4;
          auVar10 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + local_1598),auVar172._0_16_);
          auVar107._0_4_ = auVar10._0_4_ * (float)local_1410._0_4_;
          auVar107._4_4_ = auVar10._4_4_ * (float)local_1410._4_4_;
          auVar107._8_4_ = auVar10._8_4_ * fStack_1408;
          auVar107._12_4_ = auVar10._12_4_ * fStack_1404;
          auVar10 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + local_15a0),auVar147._0_16_);
          auVar125._0_4_ = auVar10._0_4_ * (float)local_1420._0_4_;
          auVar125._4_4_ = auVar10._4_4_ * (float)local_1420._4_4_;
          auVar125._8_4_ = auVar10._8_4_ * fStack_1418;
          auVar125._12_4_ = auVar10._12_4_ * fStack_1414;
          auVar76 = vminps_avx(auVar107,auVar125);
          auVar10 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + local_15a8),auVar9);
          auVar126._0_4_ = auVar10._0_4_ * (float)local_1430._0_4_;
          auVar126._4_4_ = auVar10._4_4_ * (float)local_1430._4_4_;
          auVar126._8_4_ = auVar10._8_4_ * fStack_1428;
          auVar126._12_4_ = auVar10._12_4_ * fStack_1424;
          auVar10._4_4_ = iStack_143c;
          auVar10._0_4_ = local_1440;
          auVar10._8_4_ = iStack_1438;
          auVar10._12_4_ = iStack_1434;
          auVar10 = vmaxps_avx(auVar96,auVar10);
          auVar10 = vmaxps_avx(auVar79,auVar10);
          auVar79._4_4_ = iStack_15fc;
          auVar79._0_4_ = local_1600;
          auVar79._8_4_ = iStack_15f8;
          auVar79._12_4_ = iStack_15f4;
          auVar79 = vminps_avx(auVar126,auVar79);
          auVar79 = vminps_avx(auVar76,auVar79);
          auVar79 = vcmpps_avx(auVar10,auVar79,2);
          uVar62 = vmovmskps_avx(auVar79);
          local_1570 = CONCAT44((int)(local_15a8 >> 0x20),uVar62);
          local_1380._0_16_ = auVar10;
        }
        if ((uVar72 & 8) == 0) {
          if (local_1570 == 0) {
            iVar63 = 4;
          }
          else {
            uVar71 = uVar72 & 0xfffffffffffffff0;
            lVar65 = 0;
            if (local_1570 != 0) {
              for (; (local_1570 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
              }
            }
            iVar63 = 0;
            uVar72 = *(ulong *)(uVar71 + lVar65 * 8);
            uVar70 = local_1570 - 1 & local_1570;
            if (uVar70 != 0) {
              uVar67 = *(uint *)(local_1380 + lVar65 * 4);
              lVar65 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              uVar5 = *(ulong *)(uVar71 + lVar65 * 8);
              uVar68 = *(uint *)(local_1380 + lVar65 * 4);
              uVar70 = uVar70 - 1 & uVar70;
              if (uVar70 == 0) {
                if (uVar67 < uVar68) {
                  *(ulong *)*local_1628 = uVar5;
                  *(uint *)(*local_1628 + 8) = uVar68;
                  local_1628 = local_1628 + 1;
                }
                else {
                  *(ulong *)*local_1628 = uVar72;
                  *(uint *)(*local_1628 + 8) = uVar67;
                  uVar72 = uVar5;
                  local_1628 = local_1628 + 1;
                }
              }
              else {
                auVar77._8_8_ = 0;
                auVar77._0_8_ = uVar72;
                auVar79 = vpunpcklqdq_avx(auVar77,ZEXT416(uVar67));
                auVar97._8_8_ = 0;
                auVar97._0_8_ = uVar5;
                auVar10 = vpunpcklqdq_avx(auVar97,ZEXT416(uVar68));
                lVar65 = 0;
                if (uVar70 != 0) {
                  for (; (uVar70 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                  }
                }
                auVar108._8_8_ = 0;
                auVar108._0_8_ = *(ulong *)(uVar71 + lVar65 * 8);
                auVar9 = vpunpcklqdq_avx(auVar108,ZEXT416(*(uint *)(local_1380 + lVar65 * 4)));
                auVar76 = vpcmpgtd_avx(auVar10,auVar79);
                uVar70 = uVar70 - 1 & uVar70;
                if (uVar70 == 0) {
                  auVar95 = vpshufd_avx(auVar76,0xaa);
                  auVar76 = vblendvps_avx(auVar10,auVar79,auVar95);
                  auVar79 = vblendvps_avx(auVar79,auVar10,auVar95);
                  auVar10 = vpcmpgtd_avx(auVar9,auVar76);
                  auVar95 = vpshufd_avx(auVar10,0xaa);
                  auVar10 = vblendvps_avx(auVar9,auVar76,auVar95);
                  auVar76 = vblendvps_avx(auVar76,auVar9,auVar95);
                  auVar9 = vpcmpgtd_avx(auVar76,auVar79);
                  auVar95 = vpshufd_avx(auVar9,0xaa);
                  auVar9 = vblendvps_avx(auVar76,auVar79,auVar95);
                  auVar79 = vblendvps_avx(auVar79,auVar76,auVar95);
                  *local_1628 = auVar79;
                  local_1628[1] = auVar9;
                  uVar72 = auVar10._0_8_;
                  local_1628 = local_1628 + 2;
                }
                else {
                  lVar65 = 0;
                  if (uVar70 != 0) {
                    for (; (uVar70 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                    }
                  }
                  auVar142._8_8_ = 0;
                  auVar142._0_8_ = *(ulong *)(uVar71 + lVar65 * 8);
                  auVar96 = vpunpcklqdq_avx(auVar142,ZEXT416(*(uint *)(local_1380 + lVar65 * 4)));
                  auVar95 = vpshufd_avx(auVar76,0xaa);
                  auVar76 = vblendvps_avx(auVar10,auVar79,auVar95);
                  auVar79 = vblendvps_avx(auVar79,auVar10,auVar95);
                  auVar10 = vpcmpgtd_avx(auVar96,auVar9);
                  auVar95 = vpshufd_avx(auVar10,0xaa);
                  auVar10 = vblendvps_avx(auVar96,auVar9,auVar95);
                  auVar9 = vblendvps_avx(auVar9,auVar96,auVar95);
                  auVar95 = vpcmpgtd_avx(auVar9,auVar79);
                  auVar96 = vpshufd_avx(auVar95,0xaa);
                  auVar95 = vblendvps_avx(auVar9,auVar79,auVar96);
                  auVar79 = vblendvps_avx(auVar79,auVar9,auVar96);
                  auVar9 = vpcmpgtd_avx(auVar10,auVar76);
                  auVar96 = vpshufd_avx(auVar9,0xaa);
                  auVar9 = vblendvps_avx(auVar10,auVar76,auVar96);
                  auVar10 = vblendvps_avx(auVar76,auVar10,auVar96);
                  auVar76 = vpcmpgtd_avx(auVar95,auVar10);
                  auVar96 = vpshufd_avx(auVar76,0xaa);
                  auVar76 = vblendvps_avx(auVar95,auVar10,auVar96);
                  auVar10 = vblendvps_avx(auVar10,auVar95,auVar96);
                  *local_1628 = auVar79;
                  local_1628[1] = auVar10;
                  local_1628[2] = auVar76;
                  uVar72 = auVar9._0_8_;
                  local_1628 = local_1628 + 3;
                }
                auVar147 = ZEXT1664(local_1610);
              }
            }
          }
        }
        else {
          iVar63 = 6;
        }
      } while (iVar63 == 0);
      if (iVar63 == 6) {
        local_15b0 = (ulong)((uint)uVar72 & 0xf) - 8;
        if (local_15b0 != 0) {
          uVar72 = uVar72 & 0xfffffffffffffff0;
          local_1578 = 0;
          local_1568 = uVar72;
          do {
            lVar65 = local_1578 * 0x58;
            local_1560 = uVar72 + lVar65;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = *(ulong *)(uVar72 + 0x20 + lVar65);
            auVar98._8_8_ = 0;
            auVar98._0_8_ = *(ulong *)(uVar72 + 0x24 + lVar65);
            auVar79 = vpminub_avx(auVar78,auVar98);
            auVar9 = vpcmpeqb_avx(auVar78,auVar79);
            fVar74 = *(float *)(uVar72 + 0x38 + lVar65);
            fVar87 = *(float *)(uVar72 + 0x44 + lVar65);
            auVar127._8_8_ = 0;
            auVar127._0_8_ = *(ulong *)(local_15b8 + 0x20 + local_1560);
            auVar79 = vpmovzxbd_avx(auVar127);
            auVar79 = vcvtdq2ps_avx(auVar79);
            auVar128._0_4_ = fVar74 + fVar87 * auVar79._0_4_;
            auVar128._4_4_ = fVar74 + fVar87 * auVar79._4_4_;
            auVar128._8_4_ = fVar74 + fVar87 * auVar79._8_4_;
            auVar128._12_4_ = fVar74 + fVar87 * auVar79._12_4_;
            auVar143._8_8_ = 0;
            auVar143._0_8_ = *(ulong *)(local_15c0 + 0x20 + local_1560);
            auVar79 = vpmovzxbd_avx(auVar143);
            auVar79 = vcvtdq2ps_avx(auVar79);
            auVar99._0_4_ = fVar74 + fVar87 * auVar79._0_4_;
            auVar99._4_4_ = fVar74 + fVar87 * auVar79._4_4_;
            auVar99._8_4_ = fVar74 + fVar87 * auVar79._8_4_;
            auVar99._12_4_ = fVar74 + fVar87 * auVar79._12_4_;
            fVar74 = *(float *)(uVar72 + 0x3c + lVar65);
            fVar87 = *(float *)(uVar72 + 0x48 + lVar65);
            auVar155._8_8_ = 0;
            auVar155._0_8_ = *(ulong *)(local_15c8 + 0x20 + local_1560);
            auVar79 = vpmovzxbd_avx(auVar155);
            auVar79 = vcvtdq2ps_avx(auVar79);
            auVar156._0_4_ = fVar74 + fVar87 * auVar79._0_4_;
            auVar156._4_4_ = fVar74 + fVar87 * auVar79._4_4_;
            auVar156._8_4_ = fVar74 + fVar87 * auVar79._8_4_;
            auVar156._12_4_ = fVar74 + fVar87 * auVar79._12_4_;
            auVar168._8_8_ = 0;
            auVar168._0_8_ = *(ulong *)(local_15d0 + 0x20 + local_1560);
            auVar79 = vpmovzxbd_avx(auVar168);
            auVar79 = vcvtdq2ps_avx(auVar79);
            auVar109._0_4_ = fVar74 + fVar87 * auVar79._0_4_;
            auVar109._4_4_ = fVar74 + fVar87 * auVar79._4_4_;
            auVar109._8_4_ = fVar74 + fVar87 * auVar79._8_4_;
            auVar109._12_4_ = fVar74 + fVar87 * auVar79._12_4_;
            fVar74 = *(float *)(uVar72 + 0x4c + lVar65);
            auVar169._8_8_ = 0;
            auVar169._0_8_ = *(ulong *)(local_15d8 + 0x20 + local_1560);
            auVar79 = vpmovzxbd_avx(auVar169);
            auVar79 = vcvtdq2ps_avx(auVar79);
            auVar175._8_8_ = 0;
            auVar175._0_8_ = *(ulong *)(local_15e0 + 0x20 + local_1560);
            auVar10 = vpmovzxbd_avx(auVar175);
            auVar10 = vcvtdq2ps_avx(auVar10);
            fVar87 = *(float *)(uVar72 + 0x40 + lVar65);
            auVar170._0_4_ = fVar87 + fVar74 * auVar79._0_4_;
            auVar170._4_4_ = fVar87 + fVar74 * auVar79._4_4_;
            auVar170._8_4_ = fVar87 + fVar74 * auVar79._8_4_;
            auVar170._12_4_ = fVar87 + fVar74 * auVar79._12_4_;
            auVar144._0_4_ = fVar87 + fVar74 * auVar10._0_4_;
            auVar144._4_4_ = fVar87 + fVar74 * auVar10._4_4_;
            auVar144._8_4_ = fVar87 + fVar74 * auVar10._8_4_;
            auVar144._12_4_ = fVar87 + fVar74 * auVar10._12_4_;
            auVar79 = vsubps_avx(auVar128,local_1450);
            auVar129._0_4_ = auVar194._0_4_ * auVar79._0_4_;
            auVar129._4_4_ = auVar194._4_4_ * auVar79._4_4_;
            auVar129._8_4_ = auVar194._8_4_ * auVar79._8_4_;
            auVar129._12_4_ = auVar194._12_4_ * auVar79._12_4_;
            auVar79 = vsubps_avx(auVar156,local_1610);
            auVar157._0_4_ = auVar79._0_4_ * (float)local_1460._0_4_;
            auVar157._4_4_ = auVar79._4_4_ * (float)local_1460._4_4_;
            auVar157._8_4_ = auVar79._8_4_ * fStack_1458;
            auVar157._12_4_ = auVar79._12_4_ * fStack_1454;
            auVar79 = vmaxps_avx(auVar129,auVar157);
            auVar10 = vsubps_avx(auVar99,local_1450);
            auVar100._0_4_ = auVar10._0_4_ * (float)local_1410._0_4_;
            auVar100._4_4_ = auVar10._4_4_ * (float)local_1410._4_4_;
            auVar100._8_4_ = auVar10._8_4_ * fStack_1408;
            auVar100._12_4_ = auVar10._12_4_ * fStack_1404;
            auVar10 = vsubps_avx(auVar109,local_1610);
            auVar110._0_4_ = auVar10._0_4_ * (float)local_1420._0_4_;
            auVar110._4_4_ = auVar10._4_4_ * (float)local_1420._4_4_;
            auVar110._8_4_ = auVar10._8_4_ * fStack_1418;
            auVar110._12_4_ = auVar10._12_4_ * fStack_1414;
            auVar76 = vminps_avx(auVar100,auVar110);
            auVar60._4_4_ = uStack_13ec;
            auVar60._0_4_ = local_13f0;
            auVar60._8_4_ = uStack_13e8;
            auVar60._12_4_ = uStack_13e4;
            auVar10 = vsubps_avx(auVar170,auVar60);
            auVar111._0_4_ = auVar10._0_4_ * (float)local_1400._0_4_;
            auVar111._4_4_ = auVar10._4_4_ * (float)local_1400._4_4_;
            auVar111._8_4_ = auVar10._8_4_ * fStack_13f8;
            auVar111._12_4_ = auVar10._12_4_ * fStack_13f4;
            auVar20._4_4_ = iStack_143c;
            auVar20._0_4_ = local_1440;
            auVar20._8_4_ = iStack_1438;
            auVar20._12_4_ = iStack_1434;
            auVar10 = vmaxps_avx(auVar111,auVar20);
            local_1390 = vmaxps_avx(auVar79,auVar10);
            auVar79 = vsubps_avx(auVar144,auVar60);
            auVar130._0_4_ = auVar79._0_4_ * (float)local_1430._0_4_;
            auVar130._4_4_ = auVar79._4_4_ * (float)local_1430._4_4_;
            auVar130._8_4_ = auVar79._8_4_ * fStack_1428;
            auVar130._12_4_ = auVar79._12_4_ * fStack_1424;
            auVar19._4_4_ = iStack_15fc;
            auVar19._0_4_ = local_1600;
            auVar19._8_4_ = iStack_15f8;
            auVar19._12_4_ = iStack_15f4;
            auVar79 = vminps_avx(auVar130,auVar19);
            auVar79 = vminps_avx(auVar76,auVar79);
            auVar10 = vpmovzxbd_avx(auVar9 ^ _DAT_01febe20);
            auVar79 = vcmpps_avx(local_1390,auVar79,2);
            auVar79 = vpandn_avx(auVar10,auVar79);
            auVar79 = vpslld_avx(auVar79,0x1f);
            uVar67 = vmovmskps_avx(auVar79);
            if (uVar67 != 0) {
              local_1548 = (ulong)(uVar67 & 0xff);
              do {
                lVar65 = 0;
                if (local_1548 != 0) {
                  for (; (local_1548 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                  }
                }
                if (*(float *)(local_1390 + lVar65 * 4) <= *(float *)(ray + k * 4 + 0x100)) {
                  uVar2 = *(ushort *)(local_1560 + lVar65 * 8);
                  uVar3 = *(ushort *)(local_1560 + 2 + lVar65 * 8);
                  uVar67 = *(uint *)(local_1560 + 0x50);
                  uVar68 = *(uint *)(local_1560 + 4 + lVar65 * 8);
                  local_1618 = (ulong)uVar68;
                  local_1550 = context->scene;
                  pGVar6 = (local_1550->geometries).items[uVar67].ptr;
                  local_1558 = *(long *)&pGVar6->field_0x58;
                  lVar69 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_1618;
                  local_161c = uVar2 & 0x7fff;
                  local_1620 = uVar3 & 0x7fff;
                  uVar4 = *(uint *)(local_1558 + 4 + lVar69);
                  uVar70 = (ulong)uVar4;
                  uVar71 = (ulong)(uVar4 * local_1620 + *(int *)(local_1558 + lVar69) + local_161c);
                  lVar65 = *(long *)&pGVar6[1].time_range.upper;
                  p_Var7 = pGVar6[1].intersectionFilterN;
                  auVar79 = *(undefined1 (*) [16])(lVar65 + (long)p_Var7 * uVar71);
                  auVar10 = *(undefined1 (*) [16])(lVar65 + (uVar71 + 1) * (long)p_Var7);
                  auVar76 = *(undefined1 (*) [16])(lVar65 + (uVar71 + uVar70) * (long)p_Var7);
                  lVar66 = uVar71 + uVar70 + 1;
                  auVar9 = *(undefined1 (*) [16])(lVar65 + lVar66 * (long)p_Var7);
                  uVar72 = (ulong)(-1 < (short)uVar2);
                  auVar95 = *(undefined1 (*) [16])(lVar65 + (uVar71 + uVar72 + 1) * (long)p_Var7);
                  lVar73 = uVar72 + lVar66;
                  auVar96 = *(undefined1 (*) [16])(lVar65 + lVar73 * (long)p_Var7);
                  uVar72 = 0;
                  if (-1 < (short)uVar3) {
                    uVar72 = uVar70;
                  }
                  auVar107 = *(undefined1 (*) [16])
                              (lVar65 + (uVar71 + uVar70 + uVar72) * (long)p_Var7);
                  auVar125 = *(undefined1 (*) [16])(lVar65 + (lVar66 + uVar72) * (long)p_Var7);
                  auVar126 = *(undefined1 (*) [16])(lVar65 + (uVar72 + lVar73) * (long)p_Var7);
                  auVar97 = vunpcklps_avx(auVar79,auVar9);
                  auVar79 = vunpckhps_avx(auVar79,auVar9);
                  auVar108 = vunpcklps_avx(auVar10,auVar76);
                  auVar77 = vunpckhps_avx(auVar10,auVar76);
                  auVar77 = vunpcklps_avx(auVar79,auVar77);
                  auVar142 = vunpcklps_avx(auVar97,auVar108);
                  auVar79 = vunpckhps_avx(auVar97,auVar108);
                  auVar97 = vunpcklps_avx(auVar10,auVar96);
                  auVar10 = vunpckhps_avx(auVar10,auVar96);
                  auVar108 = vunpcklps_avx(auVar95,auVar9);
                  auVar95 = vunpckhps_avx(auVar95,auVar9);
                  auVar19 = vunpcklps_avx(auVar10,auVar95);
                  auVar20 = vunpcklps_avx(auVar97,auVar108);
                  auVar10 = vunpckhps_avx(auVar97,auVar108);
                  auVar97 = vunpcklps_avx(auVar9,auVar126);
                  auVar95 = vunpckhps_avx(auVar9,auVar126);
                  auVar126 = vunpcklps_avx(auVar96,auVar125);
                  auVar96 = vunpckhps_avx(auVar96,auVar125);
                  auVar96 = vunpcklps_avx(auVar95,auVar96);
                  auVar108 = vunpcklps_avx(auVar97,auVar126);
                  auVar95 = vunpckhps_avx(auVar97,auVar126);
                  auVar126 = vunpcklps_avx(auVar76,auVar125);
                  auVar76 = vunpckhps_avx(auVar76,auVar125);
                  auVar125 = vunpcklps_avx(auVar9,auVar107);
                  auVar9 = vunpckhps_avx(auVar9,auVar107);
                  auVar9 = vunpcklps_avx(auVar76,auVar9);
                  auVar107 = vunpcklps_avx(auVar126,auVar125);
                  auVar76 = vunpckhps_avx(auVar126,auVar125);
                  auVar176._16_16_ = auVar108;
                  auVar176._0_16_ = auVar142;
                  auVar191._16_16_ = auVar95;
                  auVar191._0_16_ = auVar79;
                  auVar133._16_16_ = auVar96;
                  auVar133._0_16_ = auVar77;
                  auVar145._16_16_ = auVar20;
                  auVar145._0_16_ = auVar20;
                  auVar158._16_16_ = auVar10;
                  auVar158._0_16_ = auVar10;
                  auVar204._16_16_ = auVar19;
                  auVar204._0_16_ = auVar19;
                  auVar207._16_16_ = auVar107;
                  auVar207._0_16_ = auVar107;
                  auVar215._16_16_ = auVar76;
                  auVar215._0_16_ = auVar76;
                  auVar81._16_16_ = auVar9;
                  auVar81._0_16_ = auVar9;
                  local_1320 = &local_1629;
                  uVar62 = *(undefined4 *)(ray + k * 4);
                  auVar218._4_4_ = uVar62;
                  auVar218._0_4_ = uVar62;
                  auVar218._8_4_ = uVar62;
                  auVar218._12_4_ = uVar62;
                  auVar218._16_4_ = uVar62;
                  auVar218._20_4_ = uVar62;
                  auVar218._24_4_ = uVar62;
                  auVar218._28_4_ = uVar62;
                  uVar62 = *(undefined4 *)(ray + k * 4 + 0x20);
                  auVar226._4_4_ = uVar62;
                  auVar226._0_4_ = uVar62;
                  auVar226._8_4_ = uVar62;
                  auVar226._12_4_ = uVar62;
                  auVar226._16_4_ = uVar62;
                  auVar226._20_4_ = uVar62;
                  auVar226._24_4_ = uVar62;
                  auVar226._28_4_ = uVar62;
                  uVar62 = *(undefined4 *)(ray + k * 4 + 0x40);
                  auVar236._4_4_ = uVar62;
                  auVar236._0_4_ = uVar62;
                  auVar236._8_4_ = uVar62;
                  auVar236._12_4_ = uVar62;
                  auVar236._16_4_ = uVar62;
                  auVar236._20_4_ = uVar62;
                  auVar236._24_4_ = uVar62;
                  auVar236._28_4_ = uVar62;
                  local_10e0 = vsubps_avx(auVar176,auVar218);
                  local_1100 = vsubps_avx(auVar191,auVar226);
                  local_1120 = vsubps_avx(auVar133,auVar236);
                  auVar80 = vsubps_avx(auVar145,auVar218);
                  auVar112 = vsubps_avx(auVar158,auVar226);
                  auVar11 = vsubps_avx(auVar204,auVar236);
                  auVar12 = vsubps_avx(auVar207,auVar218);
                  auVar13 = vsubps_avx(auVar215,auVar226);
                  auVar14 = vsubps_avx(auVar81,auVar236);
                  local_1140 = vsubps_avx(auVar12,local_10e0);
                  local_1160 = vsubps_avx(auVar13,local_1100);
                  local_1180 = vsubps_avx(auVar14,local_1120);
                  fVar148 = local_1100._0_4_;
                  fVar74 = auVar13._0_4_ + fVar148;
                  fVar150 = local_1100._4_4_;
                  fVar87 = auVar13._4_4_ + fVar150;
                  fVar152 = local_1100._8_4_;
                  fVar88 = auVar13._8_4_ + fVar152;
                  fVar124 = local_1100._12_4_;
                  fVar89 = auVar13._12_4_ + fVar124;
                  fVar135 = local_1100._16_4_;
                  fVar91 = auVar13._16_4_ + fVar135;
                  fVar138 = local_1100._20_4_;
                  fVar92 = auVar13._20_4_ + fVar138;
                  fVar141 = local_1100._24_4_;
                  fVar94 = auVar13._24_4_ + fVar141;
                  fVar75 = local_1100._28_4_;
                  fVar243 = local_1120._0_4_;
                  fVar173 = fVar243 + auVar14._0_4_;
                  fVar245 = local_1120._4_4_;
                  fVar178 = fVar245 + auVar14._4_4_;
                  fVar247 = local_1120._8_4_;
                  fVar180 = fVar247 + auVar14._8_4_;
                  fVar249 = local_1120._12_4_;
                  fVar182 = fVar249 + auVar14._12_4_;
                  fVar251 = local_1120._16_4_;
                  fVar184 = fVar251 + auVar14._16_4_;
                  fVar253 = local_1120._20_4_;
                  fVar186 = fVar253 + auVar14._20_4_;
                  fVar255 = local_1120._24_4_;
                  fVar188 = fVar255 + auVar14._24_4_;
                  fVar106 = local_1120._28_4_;
                  fVar90 = local_1180._0_4_;
                  fVar93 = local_1180._4_4_;
                  auVar15._4_4_ = fVar87 * fVar93;
                  auVar15._0_4_ = fVar74 * fVar90;
                  fVar116 = local_1180._8_4_;
                  auVar15._8_4_ = fVar88 * fVar116;
                  fVar120 = local_1180._12_4_;
                  auVar15._12_4_ = fVar89 * fVar120;
                  fVar123 = local_1180._16_4_;
                  auVar15._16_4_ = fVar91 * fVar123;
                  fVar136 = local_1180._20_4_;
                  auVar15._20_4_ = fVar92 * fVar136;
                  fVar140 = local_1180._24_4_;
                  auVar15._24_4_ = fVar94 * fVar140;
                  auVar15._28_4_ = auVar95._12_4_;
                  fVar225 = local_1160._0_4_;
                  fVar228 = local_1160._4_4_;
                  auVar16._4_4_ = fVar228 * fVar178;
                  auVar16._0_4_ = fVar225 * fVar173;
                  fVar229 = local_1160._8_4_;
                  auVar16._8_4_ = fVar229 * fVar180;
                  fVar230 = local_1160._12_4_;
                  auVar16._12_4_ = fVar230 * fVar182;
                  fVar231 = local_1160._16_4_;
                  auVar16._16_4_ = fVar231 * fVar184;
                  fVar232 = local_1160._20_4_;
                  auVar16._20_4_ = fVar232 * fVar186;
                  fVar233 = local_1160._24_4_;
                  auVar16._24_4_ = fVar233 * fVar188;
                  auVar16._28_4_ = auVar107._12_4_;
                  auVar15 = vsubps_avx(auVar16,auVar15);
                  fVar149 = local_10e0._0_4_;
                  fVar206 = auVar12._0_4_ + fVar149;
                  fVar151 = local_10e0._4_4_;
                  fVar209 = auVar12._4_4_ + fVar151;
                  fVar153 = local_10e0._8_4_;
                  fVar210 = auVar12._8_4_ + fVar153;
                  fVar134 = local_10e0._12_4_;
                  fVar211 = auVar12._12_4_ + fVar134;
                  fVar137 = local_10e0._16_4_;
                  fVar212 = auVar12._16_4_ + fVar137;
                  fVar139 = local_10e0._20_4_;
                  fVar213 = auVar12._20_4_ + fVar139;
                  fVar8 = local_10e0._24_4_;
                  fVar214 = auVar12._24_4_ + fVar8;
                  fVar217 = local_1140._0_4_;
                  fVar219 = local_1140._4_4_;
                  auVar17._4_4_ = fVar219 * fVar178;
                  auVar17._0_4_ = fVar217 * fVar173;
                  fVar220 = local_1140._8_4_;
                  auVar17._8_4_ = fVar220 * fVar180;
                  fVar221 = local_1140._12_4_;
                  auVar17._12_4_ = fVar221 * fVar182;
                  fVar222 = local_1140._16_4_;
                  auVar17._16_4_ = fVar222 * fVar184;
                  fVar223 = local_1140._20_4_;
                  auVar17._20_4_ = fVar223 * fVar186;
                  fVar224 = local_1140._24_4_;
                  auVar17._24_4_ = fVar224 * fVar188;
                  auVar17._28_4_ = fVar106 + auVar14._28_4_;
                  auVar81 = local_1180;
                  auVar18._4_4_ = fVar209 * fVar93;
                  auVar18._0_4_ = fVar206 * fVar90;
                  auVar18._8_4_ = fVar210 * fVar116;
                  auVar18._12_4_ = fVar211 * fVar120;
                  auVar18._16_4_ = fVar212 * fVar123;
                  auVar18._20_4_ = fVar213 * fVar136;
                  auVar18._24_4_ = fVar214 * fVar140;
                  auVar18._28_4_ = auVar76._12_4_;
                  auVar16 = vsubps_avx(auVar18,auVar17);
                  auVar21._4_4_ = fVar209 * fVar228;
                  auVar21._0_4_ = fVar206 * fVar225;
                  auVar21._8_4_ = fVar210 * fVar229;
                  auVar21._12_4_ = fVar211 * fVar230;
                  auVar21._16_4_ = fVar212 * fVar231;
                  auVar21._20_4_ = fVar213 * fVar232;
                  auVar21._24_4_ = fVar214 * fVar233;
                  auVar21._28_4_ = auVar12._28_4_ + local_10e0._28_4_;
                  auVar22._4_4_ = fVar219 * fVar87;
                  auVar22._0_4_ = fVar217 * fVar74;
                  auVar22._8_4_ = fVar220 * fVar88;
                  auVar22._12_4_ = fVar221 * fVar89;
                  auVar22._16_4_ = fVar222 * fVar91;
                  auVar22._20_4_ = fVar223 * fVar92;
                  auVar22._24_4_ = fVar224 * fVar94;
                  auVar22._28_4_ = auVar13._28_4_ + fVar75;
                  auVar17 = vsubps_avx(auVar22,auVar21);
                  fVar74 = *(float *)(ray + k * 4 + 0xa0);
                  fVar87 = *(float *)(ray + k * 4 + 0xc0);
                  fStack_153c = *(float *)(ray + k * 4 + 0x80);
                  auVar216._0_4_ =
                       fStack_153c * auVar15._0_4_ + auVar17._0_4_ * fVar87 + fVar74 * auVar16._0_4_
                  ;
                  auVar216._4_4_ =
                       fStack_153c * auVar15._4_4_ + auVar17._4_4_ * fVar87 + fVar74 * auVar16._4_4_
                  ;
                  auVar216._8_4_ =
                       fStack_153c * auVar15._8_4_ + auVar17._8_4_ * fVar87 + fVar74 * auVar16._8_4_
                  ;
                  auVar216._12_4_ =
                       fStack_153c * auVar15._12_4_ +
                       auVar17._12_4_ * fVar87 + fVar74 * auVar16._12_4_;
                  auVar216._16_4_ =
                       fStack_153c * auVar15._16_4_ +
                       auVar17._16_4_ * fVar87 + fVar74 * auVar16._16_4_;
                  auVar216._20_4_ =
                       fStack_153c * auVar15._20_4_ +
                       auVar17._20_4_ * fVar87 + fVar74 * auVar16._20_4_;
                  auVar216._24_4_ =
                       fStack_153c * auVar15._24_4_ +
                       auVar17._24_4_ * fVar87 + fVar74 * auVar16._24_4_;
                  auVar216._28_4_ = auVar16._28_4_ + auVar17._28_4_ + auVar16._28_4_;
                  local_11a0 = vsubps_avx(local_1100,auVar112);
                  auVar15 = vsubps_avx(local_1120,auVar11);
                  fVar94 = fVar148 + auVar112._0_4_;
                  fVar178 = fVar150 + auVar112._4_4_;
                  fVar182 = fVar152 + auVar112._8_4_;
                  fVar186 = fVar124 + auVar112._12_4_;
                  fVar206 = fVar135 + auVar112._16_4_;
                  fVar210 = fVar138 + auVar112._20_4_;
                  fVar211 = fVar141 + auVar112._24_4_;
                  fVar88 = auVar112._28_4_;
                  fVar212 = fVar243 + auVar11._0_4_;
                  fVar213 = fVar245 + auVar11._4_4_;
                  fVar214 = fVar247 + auVar11._8_4_;
                  fVar197 = fVar249 + auVar11._12_4_;
                  fVar199 = fVar251 + auVar11._16_4_;
                  fVar201 = fVar253 + auVar11._20_4_;
                  fVar203 = fVar255 + auVar11._24_4_;
                  fVar89 = auVar11._28_4_;
                  fVar235 = auVar15._0_4_;
                  fVar237 = auVar15._4_4_;
                  auVar23._4_4_ = fVar237 * fVar178;
                  auVar23._0_4_ = fVar235 * fVar94;
                  fVar238 = auVar15._8_4_;
                  auVar23._8_4_ = fVar238 * fVar182;
                  fVar239 = auVar15._12_4_;
                  auVar23._12_4_ = fVar239 * fVar186;
                  fVar240 = auVar15._16_4_;
                  auVar23._16_4_ = fVar240 * fVar206;
                  fVar241 = auVar15._20_4_;
                  auVar23._20_4_ = fVar241 * fVar210;
                  fVar242 = auVar15._24_4_;
                  auVar23._24_4_ = fVar242 * fVar211;
                  auVar23._28_4_ = fVar106;
                  fVar91 = local_11a0._0_4_;
                  fVar92 = local_11a0._4_4_;
                  auVar24._4_4_ = fVar213 * fVar92;
                  auVar24._0_4_ = fVar212 * fVar91;
                  fVar173 = local_11a0._8_4_;
                  auVar24._8_4_ = fVar214 * fVar173;
                  fVar180 = local_11a0._12_4_;
                  auVar24._12_4_ = fVar197 * fVar180;
                  fVar184 = local_11a0._16_4_;
                  auVar24._16_4_ = fVar199 * fVar184;
                  fVar188 = local_11a0._20_4_;
                  auVar24._20_4_ = fVar201 * fVar188;
                  fVar209 = local_11a0._24_4_;
                  auVar24._24_4_ = fVar203 * fVar209;
                  auVar24._28_4_ = fVar75;
                  auVar16 = vsubps_avx(auVar24,auVar23);
                  auVar17 = vsubps_avx(local_10e0,auVar80);
                  fVar244 = auVar17._0_4_;
                  fVar246 = auVar17._4_4_;
                  auVar25._4_4_ = fVar246 * fVar213;
                  auVar25._0_4_ = fVar244 * fVar212;
                  fVar248 = auVar17._8_4_;
                  auVar25._8_4_ = fVar248 * fVar214;
                  fVar250 = auVar17._12_4_;
                  auVar25._12_4_ = fVar250 * fVar197;
                  fVar252 = auVar17._16_4_;
                  auVar25._16_4_ = fVar252 * fVar199;
                  fVar254 = auVar17._20_4_;
                  auVar25._20_4_ = fVar254 * fVar201;
                  fVar256 = auVar17._24_4_;
                  auVar25._24_4_ = fVar256 * fVar203;
                  auVar25._28_4_ = fVar106 + fVar89;
                  fVar212 = auVar80._0_4_ + fVar149;
                  fVar213 = auVar80._4_4_ + fVar151;
                  fVar214 = auVar80._8_4_ + fVar153;
                  fVar197 = auVar80._12_4_ + fVar134;
                  fVar199 = auVar80._16_4_ + fVar137;
                  fVar201 = auVar80._20_4_ + fVar139;
                  fVar203 = auVar80._24_4_ + fVar8;
                  fVar234 = auVar80._28_4_;
                  auVar26._4_4_ = fVar213 * fVar237;
                  auVar26._0_4_ = fVar212 * fVar235;
                  auVar26._8_4_ = fVar214 * fVar238;
                  auVar26._12_4_ = fVar197 * fVar239;
                  auVar26._16_4_ = fVar199 * fVar240;
                  auVar26._20_4_ = fVar201 * fVar241;
                  auVar26._24_4_ = fVar203 * fVar242;
                  auVar26._28_4_ = fVar234;
                  auVar17 = vsubps_avx(auVar26,auVar25);
                  auVar27._4_4_ = fVar213 * fVar92;
                  auVar27._0_4_ = fVar212 * fVar91;
                  auVar27._8_4_ = fVar214 * fVar173;
                  auVar27._12_4_ = fVar197 * fVar180;
                  auVar27._16_4_ = fVar199 * fVar184;
                  auVar27._20_4_ = fVar201 * fVar188;
                  auVar27._24_4_ = fVar203 * fVar209;
                  auVar27._28_4_ = fVar234 + local_10e0._28_4_;
                  auVar28._4_4_ = fVar246 * fVar178;
                  auVar28._0_4_ = fVar244 * fVar94;
                  auVar28._8_4_ = fVar248 * fVar182;
                  auVar28._12_4_ = fVar250 * fVar186;
                  auVar28._16_4_ = fVar252 * fVar206;
                  auVar28._20_4_ = fVar254 * fVar210;
                  auVar28._24_4_ = fVar256 * fVar211;
                  auVar28._28_4_ = fVar75 + fVar88;
                  auVar18 = vsubps_avx(auVar28,auVar27);
                  fVar211 = auVar16._28_4_;
                  local_11c0._0_4_ =
                       fStack_153c * auVar16._0_4_ + fVar74 * auVar17._0_4_ + auVar18._0_4_ * fVar87
                  ;
                  local_11c0._4_4_ =
                       fStack_153c * auVar16._4_4_ + fVar74 * auVar17._4_4_ + auVar18._4_4_ * fVar87
                  ;
                  local_11c0._8_4_ =
                       fStack_153c * auVar16._8_4_ + fVar74 * auVar17._8_4_ + auVar18._8_4_ * fVar87
                  ;
                  local_11c0._12_4_ =
                       fStack_153c * auVar16._12_4_ +
                       fVar74 * auVar17._12_4_ + auVar18._12_4_ * fVar87;
                  local_11c0._16_4_ =
                       fStack_153c * auVar16._16_4_ +
                       fVar74 * auVar17._16_4_ + auVar18._16_4_ * fVar87;
                  local_11c0._20_4_ =
                       fStack_153c * auVar16._20_4_ +
                       fVar74 * auVar17._20_4_ + auVar18._20_4_ * fVar87;
                  local_11c0._24_4_ =
                       fStack_153c * auVar16._24_4_ +
                       fVar74 * auVar17._24_4_ + auVar18._24_4_ * fVar87;
                  local_11c0._28_4_ = fVar211 + auVar17._28_4_ + auVar18._28_4_;
                  auVar16 = vsubps_avx(auVar80,auVar12);
                  fVar154 = auVar80._0_4_ + auVar12._0_4_;
                  fVar162 = auVar80._4_4_ + auVar12._4_4_;
                  fVar163 = auVar80._8_4_ + auVar12._8_4_;
                  fVar164 = auVar80._12_4_ + auVar12._12_4_;
                  fVar165 = auVar80._16_4_ + auVar12._16_4_;
                  fVar166 = auVar80._20_4_ + auVar12._20_4_;
                  fVar167 = auVar80._24_4_ + auVar12._24_4_;
                  auVar80 = vsubps_avx(auVar112,auVar13);
                  fVar106 = auVar112._0_4_ + auVar13._0_4_;
                  fVar115 = auVar112._4_4_ + auVar13._4_4_;
                  fVar117 = auVar112._8_4_ + auVar13._8_4_;
                  fVar118 = auVar112._12_4_ + auVar13._12_4_;
                  fVar119 = auVar112._16_4_ + auVar13._16_4_;
                  fVar121 = auVar112._20_4_ + auVar13._20_4_;
                  fVar122 = auVar112._24_4_ + auVar13._24_4_;
                  auVar17 = vsubps_avx(auVar11,auVar14);
                  fVar212 = auVar11._0_4_ + auVar14._0_4_;
                  fVar213 = auVar11._4_4_ + auVar14._4_4_;
                  fVar214 = auVar11._8_4_ + auVar14._8_4_;
                  fVar197 = auVar11._12_4_ + auVar14._12_4_;
                  fVar199 = auVar11._16_4_ + auVar14._16_4_;
                  fVar201 = auVar11._20_4_ + auVar14._20_4_;
                  fVar203 = auVar11._24_4_ + auVar14._24_4_;
                  fVar75 = auVar17._0_4_;
                  fVar94 = auVar17._4_4_;
                  auVar11._4_4_ = fVar115 * fVar94;
                  auVar11._0_4_ = fVar106 * fVar75;
                  fVar178 = auVar17._8_4_;
                  auVar11._8_4_ = fVar117 * fVar178;
                  fVar182 = auVar17._12_4_;
                  auVar11._12_4_ = fVar118 * fVar182;
                  fVar186 = auVar17._16_4_;
                  auVar11._16_4_ = fVar119 * fVar186;
                  fVar206 = auVar17._20_4_;
                  auVar11._20_4_ = fVar121 * fVar206;
                  fVar210 = auVar17._24_4_;
                  auVar11._24_4_ = fVar122 * fVar210;
                  auVar11._28_4_ = fVar88;
                  fVar174 = auVar80._0_4_;
                  fVar179 = auVar80._4_4_;
                  auVar29._4_4_ = fVar179 * fVar213;
                  auVar29._0_4_ = fVar174 * fVar212;
                  fVar181 = auVar80._8_4_;
                  auVar29._8_4_ = fVar181 * fVar214;
                  fVar183 = auVar80._12_4_;
                  auVar29._12_4_ = fVar183 * fVar197;
                  fVar185 = auVar80._16_4_;
                  auVar29._16_4_ = fVar185 * fVar199;
                  fVar187 = auVar80._20_4_;
                  auVar29._20_4_ = fVar187 * fVar201;
                  fVar189 = auVar80._24_4_;
                  auVar29._24_4_ = fVar189 * fVar203;
                  auVar29._28_4_ = fVar211;
                  auVar80 = vsubps_avx(auVar29,auVar11);
                  fVar190 = auVar16._0_4_;
                  fVar195 = auVar16._4_4_;
                  auVar30._4_4_ = fVar195 * fVar213;
                  auVar30._0_4_ = fVar190 * fVar212;
                  fVar196 = auVar16._8_4_;
                  auVar30._8_4_ = fVar196 * fVar214;
                  fVar198 = auVar16._12_4_;
                  auVar30._12_4_ = fVar198 * fVar197;
                  fVar200 = auVar16._16_4_;
                  auVar30._16_4_ = fVar200 * fVar199;
                  fVar202 = auVar16._20_4_;
                  auVar30._20_4_ = fVar202 * fVar201;
                  fVar201 = auVar16._24_4_;
                  auVar30._24_4_ = fVar201 * fVar203;
                  auVar30._28_4_ = fVar89 + auVar14._28_4_;
                  auVar14._4_4_ = fVar162 * fVar94;
                  auVar14._0_4_ = fVar154 * fVar75;
                  auVar14._8_4_ = fVar163 * fVar178;
                  auVar14._12_4_ = fVar164 * fVar182;
                  auVar14._16_4_ = fVar165 * fVar186;
                  auVar14._20_4_ = fVar166 * fVar206;
                  auVar14._24_4_ = fVar167 * fVar210;
                  auVar14._28_4_ = fVar211;
                  auVar112 = vsubps_avx(auVar14,auVar30);
                  auVar31._4_4_ = fVar162 * fVar179;
                  auVar31._0_4_ = fVar154 * fVar174;
                  auVar31._8_4_ = fVar163 * fVar181;
                  auVar31._12_4_ = fVar164 * fVar183;
                  auVar31._16_4_ = fVar165 * fVar185;
                  auVar31._20_4_ = fVar166 * fVar187;
                  auVar31._24_4_ = fVar167 * fVar189;
                  auVar31._28_4_ = fVar234 + auVar12._28_4_;
                  auVar12._4_4_ = fVar195 * fVar115;
                  auVar12._0_4_ = fVar190 * fVar106;
                  auVar12._8_4_ = fVar196 * fVar117;
                  auVar12._12_4_ = fVar198 * fVar118;
                  auVar12._16_4_ = fVar200 * fVar119;
                  auVar12._20_4_ = fVar202 * fVar121;
                  auVar12._24_4_ = fVar201 * fVar122;
                  auVar12._28_4_ = fVar88 + auVar13._28_4_;
                  auVar11 = vsubps_avx(auVar12,auVar31);
                  auVar113._0_4_ =
                       fStack_153c * auVar80._0_4_ +
                       auVar11._0_4_ * fVar87 + fVar74 * auVar112._0_4_;
                  auVar113._4_4_ =
                       fStack_153c * auVar80._4_4_ +
                       auVar11._4_4_ * fVar87 + fVar74 * auVar112._4_4_;
                  auVar113._8_4_ =
                       fStack_153c * auVar80._8_4_ +
                       auVar11._8_4_ * fVar87 + fVar74 * auVar112._8_4_;
                  auVar113._12_4_ =
                       fStack_153c * auVar80._12_4_ +
                       auVar11._12_4_ * fVar87 + fVar74 * auVar112._12_4_;
                  auVar113._16_4_ =
                       fStack_153c * auVar80._16_4_ +
                       auVar11._16_4_ * fVar87 + fVar74 * auVar112._16_4_;
                  auVar113._20_4_ =
                       fStack_153c * auVar80._20_4_ +
                       auVar11._20_4_ * fVar87 + fVar74 * auVar112._20_4_;
                  auVar113._24_4_ =
                       fStack_153c * auVar80._24_4_ +
                       auVar11._24_4_ * fVar87 + fVar74 * auVar112._24_4_;
                  auVar113._28_4_ = auVar11._28_4_ + auVar11._28_4_ + auVar112._28_4_;
                  auVar101._0_4_ = auVar113._0_4_ + auVar216._0_4_ + local_11c0._0_4_;
                  auVar101._4_4_ = auVar113._4_4_ + auVar216._4_4_ + local_11c0._4_4_;
                  auVar101._8_4_ = auVar113._8_4_ + auVar216._8_4_ + local_11c0._8_4_;
                  auVar101._12_4_ = auVar113._12_4_ + auVar216._12_4_ + local_11c0._12_4_;
                  local_1340._16_4_ = auVar113._16_4_ + auVar216._16_4_ + local_11c0._16_4_;
                  local_1340._0_16_ = auVar101;
                  local_1340._20_4_ = auVar113._20_4_ + auVar216._20_4_ + local_11c0._20_4_;
                  local_1340._24_4_ = auVar113._24_4_ + auVar216._24_4_ + local_11c0._24_4_;
                  local_1340._28_4_ = auVar113._28_4_ + auVar216._28_4_ + local_11c0._28_4_;
                  auVar80 = vminps_avx(auVar216,local_11c0);
                  auVar80 = vminps_avx(auVar80,auVar113);
                  auVar159._8_4_ = 0x7fffffff;
                  auVar159._0_8_ = 0x7fffffff7fffffff;
                  auVar159._12_4_ = 0x7fffffff;
                  auVar159._16_4_ = 0x7fffffff;
                  auVar159._20_4_ = 0x7fffffff;
                  auVar159._24_4_ = 0x7fffffff;
                  auVar159._28_4_ = 0x7fffffff;
                  local_11e0 = vandps_avx(local_1340,auVar159);
                  fVar88 = local_11e0._0_4_ * 1.1920929e-07;
                  fVar211 = local_11e0._4_4_ * 1.1920929e-07;
                  auVar13._4_4_ = fVar211;
                  auVar13._0_4_ = fVar88;
                  fVar212 = local_11e0._8_4_ * 1.1920929e-07;
                  auVar13._8_4_ = fVar212;
                  fVar213 = local_11e0._12_4_ * 1.1920929e-07;
                  auVar13._12_4_ = fVar213;
                  fVar214 = local_11e0._16_4_ * 1.1920929e-07;
                  auVar13._16_4_ = fVar214;
                  fVar197 = local_11e0._20_4_ * 1.1920929e-07;
                  auVar13._20_4_ = fVar197;
                  fVar199 = local_11e0._24_4_ * 1.1920929e-07;
                  auVar13._24_4_ = fVar199;
                  auVar13._28_4_ = 0x34000000;
                  auVar171._0_8_ = CONCAT44(fVar211,fVar88) ^ 0x8000000080000000;
                  auVar171._8_4_ = -fVar212;
                  auVar171._12_4_ = -fVar213;
                  auVar171._16_4_ = -fVar214;
                  auVar171._20_4_ = -fVar197;
                  auVar171._24_4_ = -fVar199;
                  auVar171._28_4_ = 0xb4000000;
                  auVar80 = vcmpps_avx(auVar80,auVar171,5);
                  auVar11 = vmaxps_avx(auVar216,local_11c0);
                  auVar112 = vmaxps_avx(auVar11,auVar113);
                  auVar112 = vcmpps_avx(auVar112,auVar13,2);
                  auVar80 = vorps_avx(auVar80,auVar112);
                  uVar72 = local_1568;
                  if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar80 >> 0x7f,0) != '\0') ||
                        (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar80 >> 0xbf,0) != '\0') ||
                      (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar80[0x1f] < '\0') {
                    auVar32._4_4_ = fVar92 * fVar93;
                    auVar32._0_4_ = fVar91 * fVar90;
                    auVar32._8_4_ = fVar173 * fVar116;
                    auVar32._12_4_ = fVar180 * fVar120;
                    auVar32._16_4_ = fVar184 * fVar123;
                    auVar32._20_4_ = fVar188 * fVar136;
                    auVar32._24_4_ = fVar209 * fVar140;
                    auVar32._28_4_ = auVar112._28_4_;
                    auVar33._4_4_ = fVar228 * fVar237;
                    auVar33._0_4_ = fVar225 * fVar235;
                    auVar33._8_4_ = fVar229 * fVar238;
                    auVar33._12_4_ = fVar230 * fVar239;
                    auVar33._16_4_ = fVar231 * fVar240;
                    auVar33._20_4_ = fVar232 * fVar241;
                    auVar33._24_4_ = fVar233 * fVar242;
                    auVar33._28_4_ = 0x34000000;
                    auVar12 = vsubps_avx(auVar33,auVar32);
                    auVar34._4_4_ = fVar237 * fVar179;
                    auVar34._0_4_ = fVar235 * fVar174;
                    auVar34._8_4_ = fVar238 * fVar181;
                    auVar34._12_4_ = fVar239 * fVar183;
                    auVar34._16_4_ = fVar240 * fVar185;
                    auVar34._20_4_ = fVar241 * fVar187;
                    auVar34._24_4_ = fVar242 * fVar189;
                    auVar34._28_4_ = auVar11._28_4_;
                    auVar35._4_4_ = fVar92 * fVar94;
                    auVar35._0_4_ = fVar91 * fVar75;
                    auVar35._8_4_ = fVar173 * fVar178;
                    auVar35._12_4_ = fVar180 * fVar182;
                    auVar35._16_4_ = fVar184 * fVar186;
                    auVar35._20_4_ = fVar188 * fVar206;
                    auVar35._24_4_ = fVar209 * fVar210;
                    auVar35._28_4_ = local_11c0._28_4_;
                    auVar13 = vsubps_avx(auVar35,auVar34);
                    auVar227._8_4_ = 0x7fffffff;
                    auVar227._0_8_ = 0x7fffffff7fffffff;
                    auVar227._12_4_ = 0x7fffffff;
                    auVar227._16_4_ = 0x7fffffff;
                    auVar227._20_4_ = 0x7fffffff;
                    auVar227._24_4_ = 0x7fffffff;
                    auVar227._28_4_ = 0x7fffffff;
                    auVar112 = vandps_avx(auVar227,auVar32);
                    auVar11 = vandps_avx(auVar227,auVar34);
                    auVar112 = vcmpps_avx(auVar112,auVar11,1);
                    auVar13 = vblendvps_avx(auVar13,auVar12,auVar112);
                    auVar36._4_4_ = fVar246 * fVar94;
                    auVar36._0_4_ = fVar244 * fVar75;
                    auVar36._8_4_ = fVar248 * fVar178;
                    auVar36._12_4_ = fVar250 * fVar182;
                    auVar36._16_4_ = fVar252 * fVar186;
                    auVar36._20_4_ = fVar254 * fVar206;
                    auVar36._24_4_ = fVar256 * fVar210;
                    auVar36._28_4_ = auVar12._28_4_;
                    auVar37._4_4_ = fVar246 * fVar93;
                    auVar37._0_4_ = fVar244 * fVar90;
                    auVar37._8_4_ = fVar248 * fVar116;
                    auVar37._12_4_ = fVar250 * fVar120;
                    auVar37._16_4_ = fVar252 * fVar123;
                    auVar37._20_4_ = fVar254 * fVar136;
                    auVar37._24_4_ = fVar256 * fVar140;
                    auVar37._28_4_ = auVar11._28_4_;
                    auVar38._4_4_ = fVar219 * fVar237;
                    auVar38._0_4_ = fVar217 * fVar235;
                    auVar38._8_4_ = fVar220 * fVar238;
                    auVar38._12_4_ = fVar221 * fVar239;
                    auVar38._16_4_ = fVar222 * fVar240;
                    auVar38._20_4_ = fVar223 * fVar241;
                    auVar38._24_4_ = fVar224 * fVar242;
                    auVar38._28_4_ = fVar89;
                    auVar12 = vsubps_avx(auVar37,auVar38);
                    auVar39._4_4_ = fVar195 * fVar237;
                    auVar39._0_4_ = fVar190 * fVar235;
                    auVar39._8_4_ = fVar196 * fVar238;
                    auVar39._12_4_ = fVar198 * fVar239;
                    auVar39._16_4_ = fVar200 * fVar240;
                    auVar39._20_4_ = fVar202 * fVar241;
                    auVar39._24_4_ = fVar201 * fVar242;
                    auVar39._28_4_ = local_1180._28_4_;
                    auVar14 = vsubps_avx(auVar39,auVar36);
                    auVar112 = vandps_avx(auVar38,auVar227);
                    auVar11 = vandps_avx(auVar227,auVar36);
                    auVar11 = vcmpps_avx(auVar112,auVar11,1);
                    auVar14 = vblendvps_avx(auVar14,auVar12,auVar11);
                    auVar40._4_4_ = fVar195 * fVar92;
                    auVar40._0_4_ = fVar190 * fVar91;
                    auVar40._8_4_ = fVar196 * fVar173;
                    auVar40._12_4_ = fVar198 * fVar180;
                    auVar40._16_4_ = fVar200 * fVar184;
                    auVar40._20_4_ = fVar202 * fVar188;
                    auVar40._24_4_ = fVar201 * fVar209;
                    auVar40._28_4_ = auVar11._28_4_;
                    auVar41._4_4_ = fVar219 * fVar92;
                    auVar41._0_4_ = fVar217 * fVar91;
                    auVar41._8_4_ = fVar220 * fVar173;
                    auVar41._12_4_ = fVar221 * fVar180;
                    auVar41._16_4_ = fVar222 * fVar184;
                    auVar41._20_4_ = fVar223 * fVar188;
                    auVar41._24_4_ = fVar224 * fVar209;
                    auVar41._28_4_ = auVar12._28_4_;
                    auVar42._4_4_ = fVar246 * fVar228;
                    auVar42._0_4_ = fVar244 * fVar225;
                    auVar42._8_4_ = fVar248 * fVar229;
                    auVar42._12_4_ = fVar250 * fVar230;
                    auVar42._16_4_ = fVar252 * fVar231;
                    auVar42._20_4_ = fVar254 * fVar232;
                    auVar42._24_4_ = fVar256 * fVar233;
                    auVar42._28_4_ = auVar16._28_4_;
                    auVar43._4_4_ = fVar246 * fVar179;
                    auVar43._0_4_ = fVar244 * fVar174;
                    auVar43._8_4_ = fVar248 * fVar181;
                    auVar43._12_4_ = fVar250 * fVar183;
                    auVar43._16_4_ = fVar252 * fVar185;
                    auVar43._20_4_ = fVar254 * fVar187;
                    auVar43._24_4_ = fVar256 * fVar189;
                    auVar43._28_4_ = auVar17._28_4_;
                    auVar16 = vsubps_avx(auVar41,auVar42);
                    auVar17 = vsubps_avx(auVar43,auVar40);
                    auVar11 = vandps_avx(auVar42,auVar227);
                    auVar12 = vandps_avx(auVar227,auVar40);
                    auVar12 = vcmpps_avx(auVar11,auVar12,1);
                    auVar12 = vblendvps_avx(auVar17,auVar16,auVar12);
                    auVar79 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                    fVar123 = auVar12._0_4_;
                    fVar184 = auVar12._4_4_;
                    fVar186 = auVar12._8_4_;
                    fVar136 = auVar12._12_4_;
                    fVar188 = auVar12._16_4_;
                    fVar206 = auVar12._20_4_;
                    fVar140 = auVar12._24_4_;
                    fVar75 = auVar14._0_4_;
                    fVar88 = auVar14._4_4_;
                    fVar89 = auVar14._8_4_;
                    fVar90 = auVar14._12_4_;
                    fVar91 = auVar14._16_4_;
                    fVar93 = auVar14._20_4_;
                    fVar92 = auVar14._24_4_;
                    fVar94 = auVar13._0_4_;
                    fVar116 = auVar13._4_4_;
                    fVar173 = auVar13._8_4_;
                    fVar178 = auVar13._12_4_;
                    fVar120 = auVar13._16_4_;
                    fVar180 = auVar13._20_4_;
                    fVar182 = auVar13._24_4_;
                    fVar209 = fVar94 * fStack_153c + fVar123 * fVar87 + fVar75 * fVar74;
                    fVar210 = fVar116 * fStack_153c + fVar184 * fVar87 + fVar88 * fVar74;
                    fVar211 = fVar173 * fStack_153c + fVar186 * fVar87 + fVar89 * fVar74;
                    fVar212 = fVar178 * fStack_153c + fVar136 * fVar87 + fVar90 * fVar74;
                    fVar213 = fVar120 * fStack_153c + fVar188 * fVar87 + fVar91 * fVar74;
                    fVar214 = fVar180 * fStack_153c + fVar206 * fVar87 + fVar93 * fVar74;
                    fVar74 = fVar182 * fStack_153c + fVar140 * fVar87 + fVar92 * fVar74;
                    fVar197 = auVar80._28_4_ + 0.0 + 0.0;
                    auVar160._0_4_ = fVar209 + fVar209;
                    auVar160._4_4_ = fVar210 + fVar210;
                    auVar160._8_4_ = fVar211 + fVar211;
                    auVar160._12_4_ = fVar212 + fVar212;
                    auVar160._16_4_ = fVar213 + fVar213;
                    auVar160._20_4_ = fVar214 + fVar214;
                    auVar160._24_4_ = fVar74 + fVar74;
                    auVar160._28_4_ = fVar197 + fVar197;
                    fVar74 = fVar94 * fVar149 + fVar75 * fVar148 + fVar123 * fVar243;
                    fVar87 = fVar116 * fVar151 + fVar88 * fVar150 + fVar184 * fVar245;
                    fVar148 = fVar173 * fVar153 + fVar89 * fVar152 + fVar186 * fVar247;
                    fVar149 = fVar178 * fVar134 + fVar90 * fVar124 + fVar136 * fVar249;
                    fVar150 = fVar120 * fVar137 + fVar91 * fVar135 + fVar188 * fVar251;
                    fVar151 = fVar180 * fVar139 + fVar93 * fVar138 + fVar206 * fVar253;
                    fVar152 = fVar182 * fVar8 + fVar92 * fVar141 + fVar140 * fVar255;
                    fVar153 = auVar11._28_4_ + auVar11._28_4_ + fVar197;
                    auVar80 = vrcpps_avx(auVar160);
                    fVar124 = auVar80._0_4_;
                    fVar134 = auVar80._4_4_;
                    auVar44._4_4_ = fVar134 * auVar160._4_4_;
                    auVar44._0_4_ = fVar124 * auVar160._0_4_;
                    fVar135 = auVar80._8_4_;
                    auVar44._8_4_ = fVar135 * auVar160._8_4_;
                    fVar137 = auVar80._12_4_;
                    auVar44._12_4_ = fVar137 * auVar160._12_4_;
                    fVar138 = auVar80._16_4_;
                    auVar44._16_4_ = fVar138 * auVar160._16_4_;
                    fVar139 = auVar80._20_4_;
                    auVar44._20_4_ = fVar139 * auVar160._20_4_;
                    fVar141 = auVar80._24_4_;
                    auVar44._24_4_ = fVar141 * auVar160._24_4_;
                    auVar44._28_4_ = auVar112._28_4_;
                    auVar208._8_4_ = 0x3f800000;
                    auVar208._0_8_ = &DAT_3f8000003f800000;
                    auVar208._12_4_ = 0x3f800000;
                    auVar208._16_4_ = 0x3f800000;
                    auVar208._20_4_ = 0x3f800000;
                    auVar208._24_4_ = 0x3f800000;
                    auVar208._28_4_ = 0x3f800000;
                    auVar80 = vsubps_avx(auVar208,auVar44);
                    local_13e0._4_4_ = (fVar134 + fVar134 * auVar80._4_4_) * (fVar87 + fVar87);
                    local_13e0._0_4_ = (fVar124 + fVar124 * auVar80._0_4_) * (fVar74 + fVar74);
                    local_13e0._8_4_ = (fVar135 + fVar135 * auVar80._8_4_) * (fVar148 + fVar148);
                    local_13e0._12_4_ = (fVar137 + fVar137 * auVar80._12_4_) * (fVar149 + fVar149);
                    local_13e0._16_4_ = (fVar138 + fVar138 * auVar80._16_4_) * (fVar150 + fVar150);
                    local_13e0._20_4_ = (fVar139 + fVar139 * auVar80._20_4_) * (fVar151 + fVar151);
                    local_13e0._24_4_ = (fVar141 + fVar141 * auVar80._24_4_) * (fVar152 + fVar152);
                    local_13e0._28_4_ = fVar153 + fVar153;
                    uVar62 = *(undefined4 *)(ray + k * 4 + 0x60);
                    auVar192._4_4_ = uVar62;
                    auVar192._0_4_ = uVar62;
                    auVar192._8_4_ = uVar62;
                    auVar192._12_4_ = uVar62;
                    auVar192._16_4_ = uVar62;
                    auVar192._20_4_ = uVar62;
                    auVar192._24_4_ = uVar62;
                    auVar192._28_4_ = uVar62;
                    auVar80 = vcmpps_avx(auVar192,local_13e0,2);
                    auVar10 = vpermilps_avx(ZEXT416((uint)*(float *)(ray + k * 4 + 0x100)),0);
                    auVar205._16_16_ = auVar10;
                    auVar205._0_16_ = auVar10;
                    auVar112 = vcmpps_avx(local_13e0,auVar205,2);
                    auVar80 = vandps_avx(auVar112,auVar80);
                    auVar10 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                    auVar79 = vpand_avx(auVar10,auVar79);
                    auVar10 = vpmovsxwd_avx(auVar79);
                    auVar76 = vpshufd_avx(auVar79,0xee);
                    auVar76 = vpmovsxwd_avx(auVar76);
                    auVar193._16_16_ = auVar76;
                    auVar193._0_16_ = auVar10;
                    if ((((((((auVar193 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar193 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar193 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar193 >> 0x7f,0) != '\0') ||
                          (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB161(auVar76 >> 0x3f,0) != '\0') ||
                        (auVar193 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar76[0xf] < '\0') {
                      auVar80 = vcmpps_avx(auVar160,_DAT_02020f00,4);
                      auVar10 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                      auVar79 = vpand_avx(auVar79,auVar10);
                      auVar10 = vpmovsxwd_avx(auVar79);
                      auVar79 = vpunpckhwd_avx(auVar79,auVar79);
                      local_1300._16_16_ = auVar79;
                      local_1300._0_16_ = auVar10;
                      if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0 ||
                               (local_1300 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (local_1300 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(local_1300 >> 0x7f,0) != '\0')
                            || (local_1300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                            ) || SUB161(auVar79 >> 0x3f,0) != '\0') ||
                          (local_1300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar79[0xf] < '\0') {
                        local_1320 = &local_1629;
                        local_12a0 = local_13e0;
                        auVar80 = vsubps_avx(local_1340,local_11c0);
                        auVar80 = vblendvps_avx(auVar216,auVar80,local_1200);
                        auVar112 = vsubps_avx(local_1340,auVar216);
                        auVar112 = vblendvps_avx(local_11c0,auVar112,local_1200);
                        local_1280[0] = (float)local_1220._0_4_ * fVar94;
                        local_1280[1] = (float)local_1220._4_4_ * fVar116;
                        local_1280[2] = fStack_1218 * fVar173;
                        local_1280[3] = fStack_1214 * fVar178;
                        fStack_1270 = fStack_1210 * fVar120;
                        fStack_126c = fStack_120c * fVar180;
                        fStack_1268 = fStack_1208 * fVar182;
                        uStack_1264 = auVar13._28_4_;
                        local_1260[0] = (float)local_1220._0_4_ * fVar75;
                        local_1260[1] = (float)local_1220._4_4_ * fVar88;
                        local_1260[2] = fStack_1218 * fVar89;
                        local_1260[3] = fStack_1214 * fVar90;
                        fStack_1250 = fStack_1210 * fVar91;
                        fStack_124c = fStack_120c * fVar93;
                        fStack_1248 = fStack_1208 * fVar92;
                        uStack_1244 = auVar14._28_4_;
                        local_1240[0] = (float)local_1220._0_4_ * fVar123;
                        local_1240[1] = (float)local_1220._4_4_ * fVar184;
                        local_1240[2] = fStack_1218 * fVar186;
                        local_1240[3] = fStack_1214 * fVar136;
                        fStack_1230 = fStack_1210 * fVar188;
                        fStack_122c = fStack_120c * fVar206;
                        fStack_1228 = fStack_1208 * fVar140;
                        uStack_1224 = auVar14._28_4_;
                        auVar79 = vpshufd_avx(ZEXT416(local_161c),0);
                        auVar79 = vpaddd_avx(auVar79,_DAT_0201c990);
                        auVar131._0_4_ = (float)(int)(*(ushort *)(local_1558 + 8 + lVar69) - 1);
                        auVar131._4_12_ = auVar15._4_12_;
                        auVar10 = vpshufd_avx(ZEXT416(local_1620),0);
                        auVar10 = vpaddd_avx(auVar10,_DAT_0201c9a0);
                        auVar76 = vrcpss_avx(auVar131,auVar131);
                        auVar132._0_4_ = (float)(int)(*(ushort *)(local_1558 + 10 + lVar69) - 1);
                        auVar132._4_12_ = auVar101._4_12_;
                        auVar9 = vrcpss_avx(auVar132,auVar132);
                        auVar82._16_16_ = auVar79;
                        auVar82._0_16_ = auVar79;
                        auVar11 = vcvtdq2ps_avx(auVar82);
                        auVar79 = ZEXT416((uint)(auVar76._0_4_ *
                                                (2.0 - auVar76._0_4_ * auVar131._0_4_)));
                        auVar79 = vshufps_avx(auVar79,auVar79,0);
                        fVar87 = (auVar101._0_4_ * auVar11._0_4_ + auVar80._0_4_) * auVar79._0_4_;
                        fVar148 = (auVar101._4_4_ * auVar11._4_4_ + auVar80._4_4_) * auVar79._4_4_;
                        local_1380._4_4_ = fVar148;
                        local_1380._0_4_ = fVar87;
                        fVar149 = (auVar101._8_4_ * auVar11._8_4_ + auVar80._8_4_) * auVar79._8_4_;
                        local_1380._8_4_ = fVar149;
                        fVar74 = auVar79._12_4_;
                        fVar150 = (auVar101._12_4_ * auVar11._12_4_ + auVar80._12_4_) * fVar74;
                        local_1380._12_4_ = fVar150;
                        fVar151 = (local_1340._16_4_ * auVar11._16_4_ + auVar80._16_4_) *
                                  auVar79._0_4_;
                        local_1380._16_4_ = fVar151;
                        fVar152 = (local_1340._20_4_ * auVar11._20_4_ + auVar80._20_4_) *
                                  auVar79._4_4_;
                        local_1380._20_4_ = fVar152;
                        fVar153 = (local_1340._24_4_ * auVar11._24_4_ + auVar80._24_4_) *
                                  auVar79._8_4_;
                        local_1380._24_4_ = fVar153;
                        local_1380._28_4_ = fVar74;
                        auVar83._16_16_ = auVar10;
                        auVar83._0_16_ = auVar10;
                        auVar80 = vcvtdq2ps_avx(auVar83);
                        auVar79 = ZEXT416((uint)(auVar9._0_4_ *
                                                (2.0 - auVar9._0_4_ * auVar132._0_4_)));
                        auVar79 = vshufps_avx(auVar79,auVar79,0);
                        fVar124 = (auVar101._0_4_ * auVar80._0_4_ + auVar112._0_4_) * auVar79._0_4_;
                        fVar134 = (auVar101._4_4_ * auVar80._4_4_ + auVar112._4_4_) * auVar79._4_4_;
                        local_1360._4_4_ = fVar134;
                        local_1360._0_4_ = fVar124;
                        fVar135 = (auVar101._8_4_ * auVar80._8_4_ + auVar112._8_4_) * auVar79._8_4_;
                        local_1360._8_4_ = fVar135;
                        fVar137 = (auVar101._12_4_ * auVar80._12_4_ + auVar112._12_4_) *
                                  auVar79._12_4_;
                        local_1360._12_4_ = fVar137;
                        fVar138 = (local_1340._16_4_ * auVar80._16_4_ + auVar112._16_4_) *
                                  auVar79._0_4_;
                        local_1360._16_4_ = fVar138;
                        fVar139 = (local_1340._20_4_ * auVar80._20_4_ + auVar112._20_4_) *
                                  auVar79._4_4_;
                        local_1360._20_4_ = fVar139;
                        fVar141 = (local_1340._24_4_ * auVar80._24_4_ + auVar112._24_4_) *
                                  auVar79._8_4_;
                        local_1360._24_4_ = fVar141;
                        local_1360._28_4_ = auVar79._12_4_;
                        pGVar6 = (local_1550->geometries).items[uVar67].ptr;
                        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                          auVar80 = vrcpps_avx(local_1340);
                          auVar147 = ZEXT3264(local_13e0);
                          fVar8 = auVar80._0_4_;
                          fVar75 = auVar80._4_4_;
                          auVar45._4_4_ = auVar101._4_4_ * fVar75;
                          auVar45._0_4_ = auVar101._0_4_ * fVar8;
                          fVar88 = auVar80._8_4_;
                          auVar45._8_4_ = auVar101._8_4_ * fVar88;
                          fVar89 = auVar80._12_4_;
                          auVar45._12_4_ = auVar101._12_4_ * fVar89;
                          fVar90 = auVar80._16_4_;
                          auVar45._16_4_ = local_1340._16_4_ * fVar90;
                          fVar91 = auVar80._20_4_;
                          auVar45._20_4_ = local_1340._20_4_ * fVar91;
                          fVar93 = auVar80._24_4_;
                          auVar45._24_4_ = local_1340._24_4_ * fVar93;
                          auVar45._28_4_ = local_1340._28_4_;
                          auVar161._8_4_ = 0x3f800000;
                          auVar161._0_8_ = &DAT_3f8000003f800000;
                          auVar161._12_4_ = 0x3f800000;
                          auVar161._16_4_ = 0x3f800000;
                          auVar161._20_4_ = 0x3f800000;
                          auVar161._24_4_ = 0x3f800000;
                          auVar161._28_4_ = 0x3f800000;
                          auVar112 = vsubps_avx(auVar161,auVar45);
                          auVar102._0_4_ = fVar8 + fVar8 * auVar112._0_4_;
                          auVar102._4_4_ = fVar75 + fVar75 * auVar112._4_4_;
                          auVar102._8_4_ = fVar88 + fVar88 * auVar112._8_4_;
                          auVar102._12_4_ = fVar89 + fVar89 * auVar112._12_4_;
                          auVar102._16_4_ = fVar90 + fVar90 * auVar112._16_4_;
                          auVar102._20_4_ = fVar91 + fVar91 * auVar112._20_4_;
                          auVar102._24_4_ = fVar93 + fVar93 * auVar112._24_4_;
                          auVar102._28_4_ = auVar80._28_4_ + auVar112._28_4_;
                          auVar146._8_4_ = 0x219392ef;
                          auVar146._0_8_ = 0x219392ef219392ef;
                          auVar146._12_4_ = 0x219392ef;
                          auVar146._16_4_ = 0x219392ef;
                          auVar146._20_4_ = 0x219392ef;
                          auVar146._24_4_ = 0x219392ef;
                          auVar146._28_4_ = 0x219392ef;
                          auVar80 = vcmpps_avx(local_11e0,auVar146,5);
                          auVar80 = vandps_avx(auVar80,auVar102);
                          auVar46._4_4_ = fVar148 * auVar80._4_4_;
                          auVar46._0_4_ = fVar87 * auVar80._0_4_;
                          auVar46._8_4_ = fVar149 * auVar80._8_4_;
                          auVar46._12_4_ = fVar150 * auVar80._12_4_;
                          auVar46._16_4_ = fVar151 * auVar80._16_4_;
                          auVar46._20_4_ = fVar152 * auVar80._20_4_;
                          auVar46._24_4_ = fVar153 * auVar80._24_4_;
                          auVar46._28_4_ = fVar74;
                          local_12e0 = vminps_avx(auVar46,auVar161);
                          auVar47._4_4_ = fVar134 * auVar80._4_4_;
                          auVar47._0_4_ = fVar124 * auVar80._0_4_;
                          auVar47._8_4_ = fVar135 * auVar80._8_4_;
                          auVar47._12_4_ = fVar137 * auVar80._12_4_;
                          auVar47._16_4_ = fVar138 * auVar80._16_4_;
                          auVar47._20_4_ = fVar139 * auVar80._20_4_;
                          auVar47._24_4_ = fVar141 * auVar80._24_4_;
                          auVar47._28_4_ = auVar80._28_4_;
                          local_12c0 = vminps_avx(auVar47,auVar161);
                          auVar103._8_4_ = 0x7f800000;
                          auVar103._0_8_ = 0x7f8000007f800000;
                          auVar103._12_4_ = 0x7f800000;
                          auVar103._16_4_ = 0x7f800000;
                          auVar103._20_4_ = 0x7f800000;
                          auVar103._24_4_ = 0x7f800000;
                          auVar103._28_4_ = 0x7f800000;
                          auVar80 = vblendvps_avx(auVar103,local_13e0,local_1300);
                          auVar112 = vshufps_avx(auVar80,auVar80,0xb1);
                          auVar112 = vminps_avx(auVar80,auVar112);
                          auVar11 = vshufpd_avx(auVar112,auVar112,5);
                          auVar112 = vminps_avx(auVar112,auVar11);
                          auVar11 = vperm2f128_avx(auVar112,auVar112,1);
                          auVar112 = vminps_avx(auVar112,auVar11);
                          auVar112 = vcmpps_avx(auVar80,auVar112,0);
                          auVar11 = local_1300 & auVar112;
                          auVar80 = local_1300;
                          if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar11 >> 0x7f,0) != '\0') ||
                                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar11 >> 0xbf,0) != '\0') ||
                              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar11[0x1f] < '\0') {
                            auVar80 = vandps_avx(auVar112,local_1300);
                          }
                          uVar64 = vmovmskps_avx(auVar80);
                          uVar4 = 0;
                          if (uVar64 != 0) {
                            for (; (uVar64 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                            }
                          }
                          uVar71 = (ulong)uVar4;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar62 = *(undefined4 *)(local_12e0 + uVar71 * 4);
                            uVar1 = *(undefined4 *)(local_12c0 + uVar71 * 4);
                            fVar74 = local_1280[uVar71];
                            fVar87 = local_1260[uVar71];
                            fVar148 = local_1240[uVar71];
                            *(float *)(ray + k * 4 + 0x100) = local_1280[uVar71 - 8];
                            *(float *)(ray + k * 4 + 0x180) = fVar74;
                            *(float *)(ray + k * 4 + 0x1a0) = fVar87;
                            *(float *)(ray + k * 4 + 0x1c0) = fVar148;
                            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar62;
                            *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                            *(uint *)(ray + k * 4 + 0x220) = uVar68;
                            *(uint *)(ray + k * 4 + 0x240) = uVar67;
                            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                          }
                          else {
                            auVar79 = vpshufd_avx(ZEXT416(uVar67),0);
                            local_14a0._16_16_ = auVar79;
                            local_14a0._0_16_ = auVar79;
                            auVar79 = vshufps_avx(ZEXT416(uVar68),ZEXT416(uVar68),0);
                            local_14c0._16_16_ = auVar79;
                            local_14c0._0_16_ = auVar79;
                            uStack_14d0 = *local_15f0;
                            local_14e0 = *local_15e8;
                            uStack_14c8 = local_15f0[1];
                            fStack_1538 = fStack_153c;
                            fStack_1534 = fStack_153c;
                            fStack_1530 = fStack_153c;
                            fStack_152c = fStack_153c;
                            fStack_1528 = fStack_153c;
                            fStack_1524 = fStack_153c;
                            local_13c0 = local_1300;
                            local_1180 = auVar81;
                            do {
                              local_1540 = *(undefined4 *)(ray + k * 4 + 0x100);
                              local_1060 = *(undefined4 *)(local_12e0 + uVar71 * 4);
                              local_1040 = *(undefined4 *)(local_12c0 + uVar71 * 4);
                              *(float *)(ray + k * 4 + 0x100) = local_1280[uVar71 - 8];
                              fVar74 = local_1280[uVar71];
                              auVar114._4_4_ = fVar74;
                              auVar114._0_4_ = fVar74;
                              auVar114._8_4_ = fVar74;
                              auVar114._12_4_ = fVar74;
                              auVar114._16_4_ = fVar74;
                              auVar114._20_4_ = fVar74;
                              auVar114._24_4_ = fVar74;
                              auVar114._28_4_ = fVar74;
                              fVar87 = local_1260[uVar71];
                              local_10a0._4_4_ = fVar87;
                              local_10a0._0_4_ = fVar87;
                              local_10a0._8_4_ = fVar87;
                              local_10a0._12_4_ = fVar87;
                              local_10a0._16_4_ = fVar87;
                              local_10a0._20_4_ = fVar87;
                              local_10a0._24_4_ = fVar87;
                              local_10a0._28_4_ = fVar87;
                              fVar87 = local_1240[uVar71];
                              local_1080._4_4_ = fVar87;
                              local_1080._0_4_ = fVar87;
                              local_1080._8_4_ = fVar87;
                              local_1080._12_4_ = fVar87;
                              local_1080._16_4_ = fVar87;
                              local_1080._20_4_ = fVar87;
                              local_1080._24_4_ = fVar87;
                              local_1080._28_4_ = fVar87;
                              local_1510.context = context->user;
                              local_10c0[0] = (RTCHitN)SUB41(fVar74,0);
                              local_10c0[1] = (RTCHitN)(char)((uint)fVar74 >> 8);
                              local_10c0[2] = (RTCHitN)(char)((uint)fVar74 >> 0x10);
                              local_10c0[3] = (RTCHitN)(char)((uint)fVar74 >> 0x18);
                              local_10c0[4] = (RTCHitN)SUB41(fVar74,0);
                              local_10c0[5] = (RTCHitN)(char)((uint)fVar74 >> 8);
                              local_10c0[6] = (RTCHitN)(char)((uint)fVar74 >> 0x10);
                              local_10c0[7] = (RTCHitN)(char)((uint)fVar74 >> 0x18);
                              local_10c0[8] = (RTCHitN)SUB41(fVar74,0);
                              local_10c0[9] = (RTCHitN)(char)((uint)fVar74 >> 8);
                              local_10c0[10] = (RTCHitN)(char)((uint)fVar74 >> 0x10);
                              local_10c0[0xb] = (RTCHitN)(char)((uint)fVar74 >> 0x18);
                              local_10c0[0xc] = (RTCHitN)SUB41(fVar74,0);
                              local_10c0[0xd] = (RTCHitN)(char)((uint)fVar74 >> 8);
                              local_10c0[0xe] = (RTCHitN)(char)((uint)fVar74 >> 0x10);
                              local_10c0[0xf] = (RTCHitN)(char)((uint)fVar74 >> 0x18);
                              local_10c0[0x10] = (RTCHitN)SUB41(fVar74,0);
                              local_10c0[0x11] = (RTCHitN)(char)((uint)fVar74 >> 8);
                              local_10c0[0x12] = (RTCHitN)(char)((uint)fVar74 >> 0x10);
                              local_10c0[0x13] = (RTCHitN)(char)((uint)fVar74 >> 0x18);
                              local_10c0[0x14] = (RTCHitN)SUB41(fVar74,0);
                              local_10c0[0x15] = (RTCHitN)(char)((uint)fVar74 >> 8);
                              local_10c0[0x16] = (RTCHitN)(char)((uint)fVar74 >> 0x10);
                              local_10c0[0x17] = (RTCHitN)(char)((uint)fVar74 >> 0x18);
                              local_10c0[0x18] = (RTCHitN)SUB41(fVar74,0);
                              local_10c0[0x19] = (RTCHitN)(char)((uint)fVar74 >> 8);
                              local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar74 >> 0x10);
                              local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar74 >> 0x18);
                              local_10c0[0x1c] = (RTCHitN)SUB41(fVar74,0);
                              local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar74 >> 8);
                              local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar74 >> 0x10);
                              local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar74 >> 0x18);
                              uStack_105c = local_1060;
                              uStack_1058 = local_1060;
                              uStack_1054 = local_1060;
                              uStack_1050 = local_1060;
                              uStack_104c = local_1060;
                              uStack_1048 = local_1060;
                              uStack_1044 = local_1060;
                              uStack_103c = local_1040;
                              uStack_1038 = local_1040;
                              uStack_1034 = local_1040;
                              uStack_1030 = local_1040;
                              uStack_102c = local_1040;
                              uStack_1028 = local_1040;
                              uStack_1024 = local_1040;
                              local_1020 = local_14c0._0_8_;
                              uStack_1018 = local_14c0._8_8_;
                              uStack_1010 = local_14c0._16_8_;
                              uStack_1008 = local_14c0._24_8_;
                              local_1000 = local_14a0._0_8_;
                              uStack_ff8 = local_14a0._8_8_;
                              uStack_ff0 = local_14a0._16_8_;
                              uStack_fe8 = local_14a0._24_8_;
                              auVar80 = vcmpps_avx(auVar114,auVar114,0xf);
                              uStack_fdc = (local_1510.context)->instID[0];
                              local_fe0 = uStack_fdc;
                              uStack_fd8 = uStack_fdc;
                              uStack_fd4 = uStack_fdc;
                              uStack_fd0 = uStack_fdc;
                              uStack_fcc = uStack_fdc;
                              uStack_fc8 = uStack_fdc;
                              uStack_fc4 = uStack_fdc;
                              uStack_fbc = (local_1510.context)->instPrimID[0];
                              local_fc0 = uStack_fbc;
                              uStack_fb8 = uStack_fbc;
                              uStack_fb4 = uStack_fbc;
                              uStack_fb0 = uStack_fbc;
                              uStack_fac = uStack_fbc;
                              uStack_fa8 = uStack_fbc;
                              uStack_fa4 = uStack_fbc;
                              local_1480 = local_14e0._0_8_;
                              uStack_1478 = local_14e0._8_8_;
                              uStack_1470 = uStack_14d0;
                              uStack_1468 = uStack_14c8;
                              local_1510.valid = (int *)&local_1480;
                              local_1510.geometryUserPtr = pGVar6->userPtr;
                              local_1510.hit = local_10c0;
                              local_1510.N = 8;
                              local_1510.ray = (RTCRayN *)ray;
                              if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar80 = ZEXT1632(auVar80._0_16_);
                                (*pGVar6->intersectionFilterN)(&local_1510);
                                auVar147 = ZEXT3264(local_13e0);
                                auVar80 = vcmpps_avx(auVar80,auVar80,0xf);
                              }
                              auVar56._8_8_ = uStack_1478;
                              auVar56._0_8_ = local_1480;
                              auVar79 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar56);
                              auVar58._8_8_ = uStack_1468;
                              auVar58._0_8_ = uStack_1470;
                              auVar10 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar58);
                              auVar84._16_16_ = auVar10;
                              auVar84._0_16_ = auVar79;
                              auVar112 = auVar80 & ~auVar84;
                              if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar112 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar112 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar112 >> 0x7f,0) == '\0')
                                    && (auVar112 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar112 >> 0xbf,0) == '\0')
                                  && (auVar112 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar112[0x1f]) {
                                auVar85._0_4_ = auVar79._0_4_ ^ auVar80._0_4_;
                                auVar85._4_4_ = auVar79._4_4_ ^ auVar80._4_4_;
                                auVar85._8_4_ = auVar79._8_4_ ^ auVar80._8_4_;
                                auVar85._12_4_ = auVar79._12_4_ ^ auVar80._12_4_;
                                auVar85._16_4_ = auVar10._0_4_ ^ auVar80._16_4_;
                                auVar85._20_4_ = auVar10._4_4_ ^ auVar80._20_4_;
                                auVar85._24_4_ = auVar10._8_4_ ^ auVar80._24_4_;
                                auVar85._28_4_ = auVar10._12_4_ ^ auVar80._28_4_;
                              }
                              else {
                                p_Var7 = context->args->filter;
                                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar80 = ZEXT1632(auVar80._0_16_);
                                  (*p_Var7)(&local_1510);
                                  auVar147 = ZEXT3264(local_13e0);
                                  auVar80 = vcmpps_avx(auVar80,auVar80,0xf);
                                }
                                auVar57._8_8_ = uStack_1478;
                                auVar57._0_8_ = local_1480;
                                auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,auVar57);
                                auVar59._8_8_ = uStack_1468;
                                auVar59._0_8_ = uStack_1470;
                                auVar10 = vpcmpeqd_avx((undefined1  [16])0x0,auVar59);
                                auVar104._16_16_ = auVar10;
                                auVar104._0_16_ = auVar79;
                                auVar85._0_4_ = auVar79._0_4_ ^ auVar80._0_4_;
                                auVar85._4_4_ = auVar79._4_4_ ^ auVar80._4_4_;
                                auVar85._8_4_ = auVar79._8_4_ ^ auVar80._8_4_;
                                auVar85._12_4_ = auVar79._12_4_ ^ auVar80._12_4_;
                                auVar85._16_4_ = auVar10._0_4_ ^ auVar80._16_4_;
                                auVar85._20_4_ = auVar10._4_4_ ^ auVar80._20_4_;
                                auVar85._24_4_ = auVar10._8_4_ ^ auVar80._24_4_;
                                auVar85._28_4_ = auVar10._12_4_ ^ auVar80._28_4_;
                                auVar80 = auVar80 & ~auVar104;
                                if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar80 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar80 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar80 >> 0x7f,0) != '\0')
                                      || (auVar80 & (undefined1  [32])0x100000000) !=
                                         (undefined1  [32])0x0) || SUB321(auVar80 >> 0xbf,0) != '\0'
                                     ) || (auVar80 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar80[0x1f] < '\0') {
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    local_1510.hit);
                                  *(undefined1 (*) [32])(local_1510.ray + 0x180) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    (local_1510.hit + 0x20));
                                  *(undefined1 (*) [32])(local_1510.ray + 0x1a0) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    (local_1510.hit + 0x40));
                                  *(undefined1 (*) [32])(local_1510.ray + 0x1c0) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    (local_1510.hit + 0x60));
                                  *(undefined1 (*) [32])(local_1510.ray + 0x1e0) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    (local_1510.hit + 0x80));
                                  *(undefined1 (*) [32])(local_1510.ray + 0x200) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    (local_1510.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_1510.ray + 0x220) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    (local_1510.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_1510.ray + 0x240) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    (local_1510.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_1510.ray + 0x260) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                    (local_1510.hit + 0x100));
                                  *(undefined1 (*) [32])(local_1510.ray + 0x280) = auVar80;
                                }
                              }
                              if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar85 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar85 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar85 >> 0x7f,0) == '\0')
                                    && (auVar85 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar85 >> 0xbf,0) == '\0')
                                  && (auVar85 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar85[0x1f]) {
                                *(undefined4 *)(ray + k * 4 + 0x100) = local_1540;
                              }
                              *(undefined4 *)(local_13c0 + uVar71 * 4) = 0;
                              uVar62 = *(undefined4 *)(ray + k * 4 + 0x100);
                              auVar86._4_4_ = uVar62;
                              auVar86._0_4_ = uVar62;
                              auVar86._8_4_ = uVar62;
                              auVar86._12_4_ = uVar62;
                              auVar86._16_4_ = uVar62;
                              auVar86._20_4_ = uVar62;
                              auVar86._24_4_ = uVar62;
                              auVar86._28_4_ = uVar62;
                              auVar112 = vcmpps_avx(auVar147._0_32_,auVar86,2);
                              auVar80 = vandps_avx(auVar112,local_13c0);
                              local_13c0 = local_13c0 & auVar112;
                              bVar54 = (local_13c0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0;
                              bVar55 = (local_13c0 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0;
                              bVar53 = (local_13c0 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0;
                              bVar52 = SUB321(local_13c0 >> 0x7f,0) != '\0';
                              bVar51 = (local_13c0 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0;
                              bVar50 = SUB321(local_13c0 >> 0xbf,0) != '\0';
                              bVar49 = (local_13c0 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0;
                              bVar48 = local_13c0[0x1f] < '\0';
                              if (((((((bVar54 || bVar55) || bVar53) || bVar52) || bVar51) || bVar50
                                   ) || bVar49) || bVar48) {
                                auVar105._8_4_ = 0x7f800000;
                                auVar105._0_8_ = 0x7f8000007f800000;
                                auVar105._12_4_ = 0x7f800000;
                                auVar105._16_4_ = 0x7f800000;
                                auVar105._20_4_ = 0x7f800000;
                                auVar105._24_4_ = 0x7f800000;
                                auVar105._28_4_ = 0x7f800000;
                                auVar112 = vblendvps_avx(auVar105,auVar147._0_32_,auVar80);
                                auVar11 = vshufps_avx(auVar112,auVar112,0xb1);
                                auVar11 = vminps_avx(auVar112,auVar11);
                                auVar12 = vshufpd_avx(auVar11,auVar11,5);
                                auVar11 = vminps_avx(auVar11,auVar12);
                                auVar12 = vperm2f128_avx(auVar11,auVar11,1);
                                auVar11 = vminps_avx(auVar11,auVar12);
                                auVar11 = vcmpps_avx(auVar112,auVar11,0);
                                auVar12 = auVar80 & auVar11;
                                auVar112 = auVar80;
                                if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar12 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar12 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar12 >> 0x7f,0) != '\0')
                                      || (auVar12 & (undefined1  [32])0x100000000) !=
                                         (undefined1  [32])0x0) || SUB321(auVar12 >> 0xbf,0) != '\0'
                                     ) || (auVar12 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar12[0x1f] < '\0') {
                                  auVar112 = vandps_avx(auVar11,auVar80);
                                }
                                uVar68 = vmovmskps_avx(auVar112);
                                uVar67 = 0;
                                if (uVar68 != 0) {
                                  for (; (uVar68 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
                                  }
                                }
                                uVar71 = (ulong)uVar67;
                              }
                              uVar72 = local_1568;
                              local_13c0 = auVar80;
                            } while (((((((bVar54 || bVar55) || bVar53) || bVar52) || bVar51) ||
                                      bVar50) || bVar49) || bVar48);
                          }
                        }
                      }
                    }
                  }
                }
                local_1548 = local_1548 & local_1548 - 1;
              } while (local_1548 != 0);
            }
            local_1578 = local_1578 + 1;
            auVar194 = ZEXT1664(local_13a0);
          } while (local_1578 != local_15b0);
        }
        iStack_15f4 = *(int *)(ray + k * 4 + 0x100);
        auVar172 = ZEXT1664(local_1450);
        auVar147 = ZEXT1664(local_1610);
        auVar177 = ZEXT1664(_local_1460);
        iStack_15f8 = iStack_15f4;
        iStack_15fc = iStack_15f4;
        local_1600 = iStack_15f4;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }